

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

int Lf_SetAddCut(Lf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  int iVar1;
  Lf_Cut_t *pLVar2;
  Lf_Cut_t *pLVar3;
  int iVar4;
  Lf_Cut_t *t;
  Lf_Cut_t *t_1;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  int nSizeC_1;
  long lVar8;
  int nSizeC;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (nCuts == 0) {
    return 1;
  }
  if (1 < nCuts) {
    uVar6 = (ulong)(uint)nCuts;
    bVar7 = true;
    uVar5 = 1;
LAB_00767f60:
    pLVar2 = pCuts[uVar6];
    uVar9 = *(uint *)&pLVar2->field_0x14 >> 0x18;
    do {
      pLVar3 = pCuts[uVar5];
      uVar11 = *(uint *)&pLVar3->field_0x14 >> 0x18;
      if ((uVar9 < uVar11) && ((pLVar2->Sign & ~pLVar3->Sign) == 0)) {
        if (*(uint *)&pLVar2->field_0x14 < 0x1000000) goto LAB_00767fc7;
        uVar12 = 0;
        uVar10 = 0;
        do {
          iVar4 = *(int *)((long)&pLVar2[1].Sign + (long)(int)uVar10 * 4);
          iVar1 = *(int *)((long)&pLVar3[1].Sign + uVar12 * 4);
          if (iVar4 < iVar1) break;
          if ((iVar1 == iVar4) && (uVar10 = uVar10 + 1, uVar10 == uVar9)) goto LAB_00767fc7;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      uVar5 = uVar5 + 1;
      if (uVar5 == uVar6) {
        if (!bVar7) goto LAB_00767fef;
        break;
      }
    } while( true );
  }
LAB_0076802b:
  if (nCuts < 1) {
    __assert_fail("nCuts >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,900,"int Lf_SetAddCut(Lf_Cut_t **, int, int)");
  }
  pLVar2 = *pCuts;
  pLVar3 = pCuts[(uint)nCuts];
  if (pLVar3->Delay <= pLVar2->Delay) {
    if (pLVar2->Delay <= pLVar3->Delay) {
      uVar9 = *(uint *)&pLVar2->field_0x14 >> 0x18;
      uVar11 = *(uint *)&pLVar3->field_0x14 >> 0x18;
      if (uVar9 < uVar11) goto LAB_007680c2;
      if (uVar9 <= uVar11) {
        if ((pLVar2->Flow < pLVar3->Flow + -0.005) || (pLVar2->Flow <= pLVar3->Flow + 0.005))
        goto LAB_007680c2;
      }
    }
    *pCuts = pLVar3;
    pCuts[(uint)nCuts] = pLVar2;
    uVar9 = *(uint *)&pLVar3->field_0x14 >> 0x18;
    if ((uVar9 < (byte)pLVar2->field_0x17) && ((pLVar3->Sign & ~pLVar2->Sign) == 0)) {
      if (*(uint *)&pLVar3->field_0x14 < 0x1000000) {
        return nCuts;
      }
      uVar6 = 0;
      uVar11 = 0;
      do {
        iVar4 = *(int *)((long)&pLVar3[1].Sign + (long)(int)uVar11 * 4);
        iVar1 = *(int *)((long)&pLVar2[1].Sign + uVar6 * 4);
        if (iVar4 < iVar1) break;
        if ((iVar1 == iVar4) && (uVar11 = uVar11 + 1, uVar11 == uVar9)) {
          return nCuts;
        }
        uVar6 = uVar6 + 1;
      } while ((byte)pLVar2->field_0x17 != uVar6);
    }
  }
LAB_007680c2:
  uVar9 = nCuts;
  if (nCuts != 1) {
    while( true ) {
      pLVar2 = pCuts[(ulong)uVar9 - 1];
      pLVar3 = pCuts[uVar9];
      uVar10 = *(uint *)&pLVar2->field_0x14 >> 0x16 & 1;
      uVar11 = *(uint *)&pLVar3->field_0x14 >> 0x16 & 1;
      if (uVar10 < uVar11) break;
      if (uVar10 <= uVar11) {
        if (pLVar2->Flow < pLVar3->Flow + -0.005) break;
        if (pLVar2->Flow <= pLVar3->Flow + 0.005) {
          if ((pLVar2->Delay < pLVar3->Delay) ||
             ((pLVar2->Delay <= pLVar3->Delay &&
              (*(uint *)&pLVar2->field_0x14 >> 0x18 < *(uint *)&pLVar3->field_0x14 >> 0x18))))
          break;
        }
      }
      pCuts[(ulong)uVar9 - 1] = pLVar3;
      pCuts[uVar9] = pLVar2;
      bVar7 = (int)uVar9 < 3;
      uVar9 = uVar9 - 1;
      if (bVar7) break;
    }
  }
  iVar4 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar4 = nCuts + 1U;
  }
  return iVar4;
LAB_00767fc7:
  *(uint *)&pLVar3->field_0x14 = *(uint *)&pLVar3->field_0x14 | 0xff000000;
  uVar5 = uVar5 + 1;
  bVar7 = false;
  if (uVar5 == uVar6) goto LAB_00767fef;
  goto LAB_00767f60;
LAB_00767fef:
  iVar4 = 1;
  uVar6 = 1;
  do {
    if (*(uint *)&pCuts[uVar6]->field_0x14 < 0xff000000) {
      lVar8 = (long)iVar4;
      if (lVar8 < (long)uVar6) {
        pLVar2 = pCuts[lVar8];
        pCuts[lVar8] = pCuts[uVar6];
        pCuts[uVar6] = pLVar2;
      }
      iVar4 = iVar4 + 1;
    }
    uVar6 = uVar6 + 1;
  } while (nCuts + 1 != uVar6);
  nCuts = iVar4 - 1;
  goto LAB_0076802b;
}

Assistant:

static inline int Lf_SetAddCut( Lf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Lf_SetLastCutContainsArea(pCuts, nCuts);
    assert( nCuts >= 1 );
    if ( Lf_CutCompareDelay(pCuts[0], pCuts[nCuts]) == 1 ) // new cut is better for delay
    {
        ABC_SWAP( Lf_Cut_t *, pCuts[0], pCuts[nCuts] );
        // if old cut (now cut number nCuts) is contained - remove it
        if ( pCuts[0]->nLeaves < pCuts[nCuts]->nLeaves && (pCuts[0]->Sign & pCuts[nCuts]->Sign) == pCuts[0]->Sign && Lf_SetCutIsContainedOrder(pCuts[nCuts], pCuts[0]) )
            return nCuts;
    }
    // sort area cuts by area
    Lf_SetSortByArea( pCuts, nCuts );
    // add new cut if there is room
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}